

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::PrintCommandTrace(cmMakefile *this,cmListFileFunction *lff)

{
  bool bVar1;
  cmake *pcVar2;
  pointer pbVar3;
  pointer pcVar4;
  int iVar5;
  long lVar6;
  ostream *poVar7;
  pointer pcVar8;
  cmListFileArgument *arg;
  pointer filename;
  pointer pcVar9;
  bool bVar10;
  string local_250;
  cmListFileFunction *local_230;
  string temp;
  string local_208;
  string local_1e8;
  string local_1c8;
  ostringstream msg;
  ios_base local_138 [264];
  
  pcVar2 = this->GlobalGenerator->CMakeInstance;
  GetExecutionFilePath_abi_cxx11_(&local_250,this);
  cmsys::SystemTools::GetFilenameName(&local_208,&local_250);
  filename = (pcVar2->TraceOnlyThisSources).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (pcVar2->TraceOnlyThisSources).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (filename != pbVar3) {
    local_230 = lff;
    do {
      lVar6 = std::__cxx11::string::rfind
                        ((char *)&local_250,(ulong)(filename->_M_dataplus)._M_p,0xffffffffffffffff);
      if ((lVar6 == -1) || (lVar6 + filename->_M_string_length != local_250._M_string_length)) {
        bVar1 = false;
LAB_00224a23:
        bVar10 = false;
      }
      else {
        cmsys::SystemTools::GetFilenameName(&local_1c8,filename);
        if (local_208._M_string_length != local_1c8._M_string_length) {
          bVar1 = true;
          goto LAB_00224a23;
        }
        bVar1 = true;
        if (local_208._M_string_length == 0) {
          bVar10 = true;
        }
        else {
          iVar5 = bcmp(local_208._M_dataplus._M_p,local_1c8._M_dataplus._M_p,
                       local_208._M_string_length);
          bVar10 = iVar5 == 0;
        }
      }
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2)) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      filename = filename + 1;
    } while (!(bool)(filename == pbVar3 | bVar10));
    lff = local_230;
    if (!bVar10) goto LAB_00224c3c;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&msg,local_250._M_dataplus._M_p,local_250._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"):  ",4);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&msg,(lff->super_cmCommandContext).Name.Original._M_dataplus._M_p,
                      (lff->super_cmCommandContext).Name.Original._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
  bVar1 = this->GlobalGenerator->CMakeInstance->TraceExpand;
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  pcVar9 = (lff->Arguments).
           super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar4 = (lff->Arguments).
           super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar9 != pcVar4) {
    do {
      pcVar8 = pcVar9;
      if (bVar1 != false) {
        std::__cxx11::string::_M_assign((string *)&temp);
        ExpandVariablesInString(this,&temp,false,false,false,(char *)0x0,-1,false,false);
        pcVar8 = (pointer)&temp;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&msg,(pcVar8->Value)._M_dataplus._M_p,(pcVar8->Value)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&msg," ",1);
      pcVar9 = pcVar9 + 1;
    } while (pcVar9 != pcVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&msg,")",1);
  std::__cxx11::stringbuf::str();
  cmSystemTools::Message(&local_1e8,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)temp._M_dataplus._M_p != &temp.field_2) {
    operator_delete(temp._M_dataplus._M_p,
                    CONCAT71(temp.field_2._M_allocated_capacity._1_7_,temp.field_2._M_local_buf[0])
                    + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  std::ios_base::~ios_base(local_138);
LAB_00224c3c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefile::PrintCommandTrace(const cmListFileFunction& lff) const
{
  // Check if current file in the list of requested to trace...
  std::vector<std::string> const& trace_only_this_files =
    this->GetCMakeInstance()->GetTraceSources();
  std::string const& full_path = this->GetExecutionFilePath();
  std::string const& only_filename = cmSystemTools::GetFilenameName(full_path);
  bool trace = trace_only_this_files.empty();
  if (!trace) {
    for (std::string const& file : trace_only_this_files) {
      std::string::size_type const pos = full_path.rfind(file);
      trace = (pos != std::string::npos) &&
        ((pos + file.size()) == full_path.size()) &&
        (only_filename == cmSystemTools::GetFilenameName(file));
      if (trace) {
        break;
      }
    }
    // Do nothing if current file wasn't requested for trace...
    if (!trace) {
      return;
    }
  }

  std::ostringstream msg;
  msg << full_path << "(" << lff.Line << "):  ";
  msg << lff.Name.Original << "(";
  bool expand = this->GetCMakeInstance()->GetTraceExpand();
  std::string temp;
  for (cmListFileArgument const& arg : lff.Arguments) {
    if (expand) {
      temp = arg.Value;
      this->ExpandVariablesInString(temp);
      msg << temp;
    } else {
      msg << arg.Value;
    }
    msg << " ";
  }
  msg << ")";
  cmSystemTools::Message(msg.str());
}